

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Import::~Import(Import *this)

{
  this->_vptr_Import = (_func_int **)&PTR__Import_001a6a48;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual ~Import() = default;